

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

fourcc_t NodeEnumClassFilterRated
                   (anynode *AnyContext,array *ListId,fourcc_t ClassId,nodeenumclassfilterrated Func
                   ,void *Param)

{
  long lVar1;
  nodeclass *pnVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  long *plVar6;
  nodeclass *pnVar7;
  bool_t bVar8;
  char *pcVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  fourcc_t local_60;
  int local_5c;
  array local_58;
  nodeclassrated Item;
  
  if (AnyContext == (anynode *)0x0) {
    __assert_fail("AnyContext != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x678,
                  "fourcc_t NodeEnumClassFilterRated(anynode *, array *, fourcc_t, nodeenumclassfilterrated, void *)"
                 );
  }
  lVar1 = **(long **)((long)AnyContext + 8);
  local_58._Begin = (char *)0x0;
  local_58._Used = 0;
  plVar6 = *(long **)(lVar1 + 0x70);
  local_60 = 0;
  sVar3 = 0;
  local_5c = 0;
  plVar11 = plVar6;
  do {
    if (plVar11 == (long *)((*(ulong *)(lVar1 + 0x78) & 0xfffffffffffffff8) + (long)plVar6)) {
      if (ListId != (array *)0x0) {
        uVar12 = local_58._Used >> 4;
        ArraySortEx(&local_58,uVar12,0x10,CmpRatedClassPri,(void *)0x0,0);
        ListId->_Begin = (char *)0x0;
        ListId->_Used = 0;
        bVar8 = ArrayAppend(ListId,(void *)0x0,uVar12 << 2,0x40);
        if (bVar8 != 0) {
          pcVar9 = ListId->_Begin;
          for (uVar12 = 0; (local_58._Used & 0xfffffffffffffff0) != uVar12; uVar12 = uVar12 + 0x10)
          {
            *(undefined4 *)pcVar9 = *(undefined4 *)(*(long *)(local_58._Begin + uVar12) + 0x50);
            pcVar9 = pcVar9 + 4;
          }
        }
        ArrayClear(&local_58);
      }
      return local_60;
    }
    pnVar2 = (nodeclass *)*plVar11;
    if ((-1 < pnVar2->State) && (pnVar7 = pnVar2, (pnVar2->Flags & 8) == 0)) {
      for (; pnVar7 != (nodeclass *)0x0; pnVar7 = pnVar7->ParentClass) {
        if (*(fourcc_t *)&pnVar7[1].Meta == ClassId) {
          iVar5 = 1;
          if ((Func != (nodeenumclassfilterrated)0x0) && (iVar5 = (*Func)(Param,pnVar2), iVar5 < 1))
          break;
          if (ListId != (array *)0x0) {
            Item.Class = (nodeclass *)*plVar11;
            Item.Rating = iVar5;
            ArrayAppend(&local_58,&Item,0x10,0x40);
            break;
          }
          if (local_5c < iVar5) {
            lVar10 = *plVar11;
            sVar4 = *(short *)(lVar10 + 0x3e);
          }
          else {
            if (local_5c != iVar5) break;
            lVar10 = *plVar11;
            sVar4 = *(short *)(lVar10 + 0x3e);
            if (*(short *)(lVar10 + 0x3e) <= sVar3) break;
          }
          sVar3 = sVar4;
          local_60 = *(fourcc_t *)(lVar10 + 0x50);
          local_5c = iVar5;
          break;
        }
      }
    }
    plVar11 = plVar11 + 1;
    plVar6 = *(long **)(lVar1 + 0x70);
  } while( true );
}

Assistant:

fourcc_t NodeEnumClassFilterRated(anynode* AnyContext, array* ListId, fourcc_t ClassId, nodeenumclassfilterrated Func, void* Param)
{
    nodecontext* p;
    const nodeclass* v;
    const nodeclass **i;
    array List;

    fourcc_t BestId = 0;
    int BestPri = 0;
    int BestRate = 0;

    assert(AnyContext != NULL);
    p = Node_Context(AnyContext);

    ArrayInit(&List);

    for (i=ARRAYBEGIN(p->NodeClass,const nodeclass*);i!=ARRAYEND(p->NodeClass,const nodeclass*);++i)
    {
        if ((*i)->State>=CLASS_REGISTERED && !((*i)->Flags & CFLAG_ABSTRACT)) // skip abstract
        {
            for (v=*i;v;v=v->ParentClass)
                if (NodeClass_ClassId(v) == ClassId)
                {
                    int Rating = Func ? Func(Param,*i):1;
                    if (Rating > 0)
                    {
                        if (!ListId)
                        {
                            if (BestRate < Rating || (BestRate == Rating && BestPri < (*i)->Priority))
                            {
                                BestId = NodeClass_ClassId(*i);
                                BestPri = (*i)->Priority;
                                BestRate = Rating;
                            }
                        }
                        else
                        {
                            nodeclassrated Item;
                            Item.Class = *i;
                            Item.Rating = Rating;
                            ArrayAppend(&List,&Item,sizeof(Item),64);
                        }
                    }
                    break;
                }
        }
    }

    if (ListId)
    {
        fourcc_t* a;
        nodeclassrated* b;
        size_t Count = ARRAYCOUNT(List,nodeclassrated);
        ArraySort(&List,nodeclassrated,CmpRatedClassPri, NULL, 0);

        ArrayInit(ListId);
        if (ArrayAppend(ListId,NULL,Count*sizeof(fourcc_t),64))
        {
            for (a=ARRAYBEGIN(*ListId,fourcc_t),b=ARRAYBEGIN(List,nodeclassrated);b!=ARRAYEND(List,nodeclassrated);++b,++a)
                *a = NodeClass_ClassId(b->Class);
        }
        ArrayClear(&List);
    }

    return BestId;
}